

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iterate.cc
# Opt level: O2

void __thiscall
ipx::Iterate::Update
          (Iterate *this,double sp,double *dx,double *dxl,double *dxu,double sd,double *dy,
          double *dzl,double *dzu)

{
  uint uVar1;
  int iVar2;
  double *pdVar3;
  pointer pSVar4;
  ulong uVar5;
  ulong uVar6;
  double dVar7;
  double dVar8;
  
  uVar1 = this->model_->num_rows_;
  iVar2 = this->model_->num_cols_;
  if (dx != (double *)0x0) {
    pdVar3 = (this->x_)._M_data;
    pSVar4 = (this->variable_state_).
             super__Vector_base<ipx::Iterate::StateDetail,_std::allocator<ipx::Iterate::StateDetail>_>
             ._M_impl.super__Vector_impl_data._M_start;
    uVar6 = 0;
    uVar5 = (ulong)(iVar2 + uVar1);
    if ((int)(iVar2 + uVar1) < 1) {
      uVar5 = uVar6;
    }
    for (; uVar5 != uVar6; uVar6 = uVar6 + 1) {
      if (pSVar4[uVar6] != FIXED) {
        pdVar3[uVar6] = dx[uVar6] * sp + pdVar3[uVar6];
      }
    }
  }
  if (dxl != (double *)0x0) {
    pdVar3 = (this->xl_)._M_data;
    pSVar4 = (this->variable_state_).
             super__Vector_base<ipx::Iterate::StateDetail,_std::allocator<ipx::Iterate::StateDetail>_>
             ._M_impl.super__Vector_impl_data._M_start;
    uVar6 = 0;
    uVar5 = (ulong)(iVar2 + uVar1);
    if ((int)(iVar2 + uVar1) < 1) {
      uVar5 = uVar6;
    }
    for (; uVar5 != uVar6; uVar6 = uVar6 + 1) {
      if ((pSVar4[uVar6] & ~BARRIER_BOXED) == BARRIER_LB) {
        dVar7 = dxl[uVar6] * sp + pdVar3[uVar6];
        dVar8 = 1e-30;
        if (1e-30 <= dVar7) {
          dVar8 = dVar7;
        }
        pdVar3[uVar6] = dVar8;
      }
    }
  }
  if (dxu != (double *)0x0) {
    pdVar3 = (this->xu_)._M_data;
    pSVar4 = (this->variable_state_).
             super__Vector_base<ipx::Iterate::StateDetail,_std::allocator<ipx::Iterate::StateDetail>_>
             ._M_impl.super__Vector_impl_data._M_start;
    uVar6 = 0;
    uVar5 = (ulong)(iVar2 + uVar1);
    if ((int)(iVar2 + uVar1) < 1) {
      uVar5 = uVar6;
    }
    for (; uVar5 != uVar6; uVar6 = uVar6 + 1) {
      if (pSVar4[uVar6] - BARRIER_UB < 2) {
        dVar7 = dxu[uVar6] * sp + pdVar3[uVar6];
        dVar8 = 1e-30;
        if (1e-30 <= dVar7) {
          dVar8 = dVar7;
        }
        pdVar3[uVar6] = dVar8;
      }
    }
  }
  if (dy != (double *)0x0) {
    pdVar3 = (this->y_)._M_data;
    uVar5 = 0;
    uVar6 = 0;
    if (0 < (int)uVar1) {
      uVar6 = (ulong)uVar1;
    }
    for (; uVar6 != uVar5; uVar5 = uVar5 + 1) {
      pdVar3[uVar5] = dy[uVar5] * sd + pdVar3[uVar5];
    }
  }
  if (dzl != (double *)0x0) {
    pdVar3 = (this->zl_)._M_data;
    pSVar4 = (this->variable_state_).
             super__Vector_base<ipx::Iterate::StateDetail,_std::allocator<ipx::Iterate::StateDetail>_>
             ._M_impl.super__Vector_impl_data._M_start;
    uVar6 = 0;
    uVar5 = (ulong)(iVar2 + uVar1);
    if ((int)(iVar2 + uVar1) < 1) {
      uVar5 = uVar6;
    }
    for (; uVar5 != uVar6; uVar6 = uVar6 + 1) {
      if ((pSVar4[uVar6] & ~BARRIER_BOXED) == BARRIER_LB) {
        dVar7 = dzl[uVar6] * sd + pdVar3[uVar6];
        dVar8 = 1e-30;
        if (1e-30 <= dVar7) {
          dVar8 = dVar7;
        }
        pdVar3[uVar6] = dVar8;
      }
    }
  }
  if (dzu != (double *)0x0) {
    pdVar3 = (this->zu_)._M_data;
    pSVar4 = (this->variable_state_).
             super__Vector_base<ipx::Iterate::StateDetail,_std::allocator<ipx::Iterate::StateDetail>_>
             ._M_impl.super__Vector_impl_data._M_start;
    uVar6 = 0;
    uVar5 = (ulong)(iVar2 + uVar1);
    if ((int)(iVar2 + uVar1) < 1) {
      uVar5 = uVar6;
    }
    for (; uVar5 != uVar6; uVar6 = uVar6 + 1) {
      if (pSVar4[uVar6] - BARRIER_UB < 2) {
        dVar7 = dzu[uVar6] * sd + pdVar3[uVar6];
        dVar8 = 1e-30;
        if (1e-30 <= dVar7) {
          dVar8 = dVar7;
        }
        pdVar3[uVar6] = dVar8;
      }
    }
  }
  this->evaluated_ = false;
  return;
}

Assistant:

void Iterate::Update(double sp, const double* dx, const double* dxl,
                     const double* dxu, double sd, const double* dy,
                     const double* dzl, const double* dzu) {
    const Int m = model_.rows();
    const Int n = model_.cols();

    if (dx) {
        for (Int j = 0; j < n+m; j++)
            if (StateOf(j) != State::fixed)
                x_[j] += sp*dx[j];
    }
    if (dxl) {
        for (Int j = 0; j < n+m; j++)
            if (has_barrier_lb(j)) {
                xl_[j] += sp*dxl[j];
                xl_[j] = std::max(xl_[j], kBarrierMin);
            }
    }
    if (dxu) {
        for (Int j = 0; j < n+m; j++)
            if (has_barrier_ub(j)) {
                xu_[j] += sp*dxu[j];
                xu_[j] = std::max(xu_[j], kBarrierMin);
            }
    }
    if (dy) {
        for (Int i = 0; i < m; i++)
            y_[i] += sd*dy[i];
    }
    if (dzl) {
        for (Int j = 0; j < n+m; j++)
            if (has_barrier_lb(j)) {
                zl_[j] += sd*dzl[j];
                zl_[j] = std::max(zl_[j], kBarrierMin);
            }
    }
    if (dzu) {
        for (Int j = 0; j < n+m; j++)
            if (has_barrier_ub(j)) {
                zu_[j] += sd*dzu[j];
                zu_[j] = std::max(zu_[j], kBarrierMin);
            }
    }
    assert_consistency();
    evaluated_ = false;
}